

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

STAmount * __thiscall
jbcoin::STObject::getFieldByConstRef<jbcoin::STAmount,jbcoin::STAmount>
          (STObject *this,SField *field,STAmount *empty)

{
  int iVar1;
  STBase *pSVar2;
  STObject *local_50;
  STAmount *cf;
  SerializedTypeID id;
  STBase *rf;
  STAmount *empty_local;
  SField *field_local;
  STObject *this_local;
  
  pSVar2 = peekAtPField(this,field);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])();
  this_local = (STObject *)empty;
  if (iVar1 != 0) {
    if (pSVar2 == (STBase *)0x0) {
      local_50 = (STObject *)0x0;
    }
    else {
      local_50 = (STObject *)__dynamic_cast(pSVar2,&STBase::typeinfo,&jbcoin::STAmount::typeinfo,0);
    }
    if (local_50 == (STObject *)0x0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    this_local = local_50;
  }
  return (STAmount *)this_local;
}

Assistant:

V const& getFieldByConstRef (SField const& field, V const& empty) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return empty; // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return *cf;
    }